

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O0

void cf_thread_set_priority(cf_thread_t t,cf_thread_priority_t p)

{
  cf_thread_priority_t p_local;
  cf_thread_t t_local;
  
  return;
}

Assistant:

void cf_thread_set_priority(cf_thread_t t, cf_thread_priority_t p) {
#ifdef CF_OS_WIN
    int priority = THREAD_PRIORITY_NORMAL;
    if (p == CF_THREAD_PRIORITY_LOW) {
        priority = THREAD_PRIORITY_LOWEST;
    } else if (p == CF_THREAD_PRIORITY_HIGH) {
        priority = THREAD_PRIORITY_HIGHEST;
    }
    SetThreadPriority(t, priority);
#else
#endif
}